

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_0::LRUCache::Unref(LRUCache *this,LRUHandle *e)

{
  LRUHandle *pLVar1;
  LRUHandle *pLVar2;
  _func_void_Slice_ptr_void_ptr *p_Var3;
  uint32_t uVar4;
  long in_FS_OFFSET;
  Slice local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (e->refs == 0) {
    __assert_fail("e->refs > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/util/cache.cc"
                  ,0xe2,"void leveldb::(anonymous namespace)::LRUCache::Unref(LRUHandle *)");
  }
  uVar4 = e->refs - 1;
  e->refs = uVar4;
  if (uVar4 == 0) {
    if (e->in_cache != false) {
      __assert_fail("!e->in_cache",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/util/cache.cc"
                    ,0xe5,"void leveldb::(anonymous namespace)::LRUCache::Unref(LRUHandle *)");
    }
    p_Var3 = e->deleter;
    local_28 = LRUHandle::key(e);
    (*p_Var3)(&local_28,e->value);
    free(e);
  }
  else if (uVar4 == 1 && e->in_cache == true) {
    pLVar1 = e->next;
    pLVar2 = e->prev;
    pLVar1->prev = pLVar2;
    pLVar2->next = pLVar1;
    e->next = &this->lru_;
    pLVar1 = (this->lru_).prev;
    e->prev = pLVar1;
    pLVar1->next = e;
    e->next->prev = e;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void LRUCache::Unref(LRUHandle* e) {
  assert(e->refs > 0);
  e->refs--;
  if (e->refs == 0) {  // Deallocate.
    assert(!e->in_cache);
    (*e->deleter)(e->key(), e->value);
    free(e);
  } else if (e->in_cache && e->refs == 1) {
    // No longer in use; move to lru_ list.
    LRU_Remove(e);
    LRU_Append(&lru_, e);
  }
}